

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O2

void __thiscall
dg::pta::PointerAnalysisFS::getMemoryObjects
          (PointerAnalysisFS *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
  *this_00;
  bool bVar1;
  iterator iVar2;
  MemoryObject *mo;
  __uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> local_30;
  
  this_00 = *(_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
              **)(where + 0x10);
  iVar2 = std::
          _Rb_tree<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>,_std::_Select1st<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
          ::find((_Rb_tree<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>,_std::_Select1st<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                  *)this_00,&pointer->target);
  if (iVar2._M_node != (_Base_ptr)(this_00 + 8)) {
    mo = (MemoryObject *)iVar2._M_node[1]._M_parent;
    std::vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>>::
    emplace_back<dg::pta::MemoryObject*>
              ((vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>> *)objects,&mo)
    ;
  }
  if (*(long *)objects == *(long *)(objects + 8)) {
    bVar1 = canChangeMM(where);
    if (bVar1) {
      mo = (MemoryObject *)operator_new(0x38);
      *(PSNode **)mo = pointer->target;
      (((_Rb_tree_header *)((long)mo + 0x10))->_M_header)._M_color = _S_red;
      *(_Base_ptr *)((long)mo + 0x18) = (_Base_ptr)0x0;
      *(_Base_ptr *)((long)mo + 0x20) = (_Base_ptr)((long)mo + 0x10);
      *(_Base_ptr *)((long)mo + 0x28) = (_Base_ptr)((long)mo + 0x10);
      *(size_t *)((long)mo + 0x30) = 0;
      local_30._M_t.
      super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
      super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl =
           (tuple<dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)
           (tuple<dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)mo;
      std::
      _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
      ::
      _M_emplace_unique<dg::pta::PSNode*const&,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>
                (this_00,&pointer->target,
                 (unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
                 &local_30);
      std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::
      ~unique_ptr((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
                  &local_30);
      std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::push_back
                (objects,&mo);
    }
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        MemoryMapT *mm = where->getData<MemoryMapT>();
        assert(mm && "Node does not have memory map");

        auto I = mm->find(pointer.target);
        if (I != mm->end()) {
            objects.push_back(I->second.get());
        }

        // if we haven't found any memory object, but this psnode
        // is a write to memory, create a new one, so that
        // the write has something to write to
        if (objects.empty() && canChangeMM(where)) {
            MemoryObject *mo = new MemoryObject(pointer.target);
            mm->emplace(pointer.target, std::unique_ptr<MemoryObject>(mo));
            objects.push_back(mo);
        }
    }